

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O2

int sprkStep_TakeStep_Compensated(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  double dVar1;
  double dVar2;
  N_Vector p_Var3;
  N_Vector p_Var4;
  N_Vector p_Var5;
  ARKodeSPRKTable pAVar6;
  ARKodeSPRKStepMem pAVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  double local_70;
  ARKodeSPRKStepMem step_mem;
  
  step_mem = (ARKodeSPRKStepMem)0x0;
  iVar8 = sprkStep_AccessStepMem(ark_mem,"sprkStep_TakeStep_Compensated",&step_mem);
  if (iVar8 == 0) {
    p_Var3 = ark_mem->tempv1;
    p_Var4 = ark_mem->tempv2;
    p_Var5 = ark_mem->tempv3;
    local_70 = 0.0;
    N_VConst(p_Var3);
    pAVar7 = step_mem;
    lVar9 = 0;
    dVar10 = 0.0;
    do {
      pAVar6 = pAVar7->method;
      if (pAVar6->stages <= lVar9) {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,p_Var3,pAVar7->yerr,p_Var3);
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var3,ark_mem->ycur);
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ark_mem->ycur,ark_mem->yn,p_Var5);
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,p_Var5,p_Var3,pAVar7->yerr);
        *nflagPtr = 0;
        *dsmPtr = 0.0;
        return 0;
      }
      dVar1 = pAVar6->a[lVar9];
      dVar2 = pAVar6->ahat[lVar9];
      dVar10 = dVar10 + dVar2;
      pAVar7->istage = (int)lVar9;
      N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var3,p_Var4);
      N_VConst(0,pAVar7->sdata);
      iVar8 = (*pAVar7->f1)(ark_mem->h * dVar10 + ark_mem->tn,p_Var4,pAVar7->sdata,
                            ark_mem->user_data);
      pAVar7->nf1 = pAVar7->nf1 + 1;
      if (iVar8 != 0) {
        return -8;
      }
      local_70 = local_70 + dVar1;
      N_VLinearSum(0x3ff0000000000000,dVar2 * ark_mem->h,p_Var3,pAVar7->sdata,p_Var3);
      N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var3,p_Var4);
      ark_mem->tcur = ark_mem->h * dVar10 + ark_mem->tn;
      N_VConst(0,pAVar7->sdata);
      iVar8 = (*pAVar7->f2)(ark_mem->h * local_70 + ark_mem->tn,p_Var4,pAVar7->sdata,
                            ark_mem->user_data);
      pAVar7->nf2 = pAVar7->nf2 + 1;
      if (iVar8 != 0) {
        return -8;
      }
      N_VLinearSum(0x3ff0000000000000,dVar1 * ark_mem->h,p_Var3,pAVar7->sdata,p_Var3);
      lVar9 = lVar9 + 1;
    } while (ark_mem->ProcessStage == (ARKPostProcessFn)0x0);
    iVar8 = -0x26;
    arkProcessError(ark_mem,-0x26,0x2a4,"sprkStep_TakeStep_Compensated",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"Compensated summation is not compatible with stage PostProcessing!\n");
  }
  return iVar8;
}

Assistant:

int sprkStep_TakeStep_Compensated(ARKodeMem ark_mem, sunrealtype* dsmPtr,
                                  int* nflagPtr)
{
  ARKodeSPRKStepMem step_mem = NULL;
  N_Vector delta_Yi          = NULL;
  N_Vector yn_plus_delta_Yi  = NULL;
  N_Vector diff              = NULL;
  sunrealtype ci             = SUN_RCONST(0.0);
  sunrealtype chati          = SUN_RCONST(0.0);
  int is                     = 0;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Vector shortcuts */
  delta_Yi         = ark_mem->tempv1;
  yn_plus_delta_Yi = ark_mem->tempv2;
  diff             = ark_mem->tempv3;

  /* [ \Delta P_0 ] = [ 0 ]
     [ \Delta Q_0 ] = [ 0 ] */
  N_VConst(ZERO, delta_Yi);

  /* loop over internal stages to the step */
  for (is = 0; is < step_mem->method->stages; is++)
  {
    /* load/compute coefficients */
    sunrealtype ai    = step_mem->method->a[is];
    sunrealtype ahati = step_mem->method->ahat[is];

    ci += ai;
    chati += ahati;

    /* store current stage index */
    step_mem->istage = is;

    /* [     ] + [            ]
       [ q_n ] + [ \Delta Q_i ] */
    N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, yn_plus_delta_Yi);

    /* Evaluate p' with the previous velocity */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f1(step_mem, ark_mem->tn + chati * ark_mem->h,
                         yn_plus_delta_Yi, step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* Incremental position update:
       [ \Delta P_i ] = [ \Delta P_{i-1} ] + [ sdata ]
       [            ] = [                ] + [       ] */
    N_VLinearSum(ONE, delta_Yi, ark_mem->h * ahati, step_mem->sdata, delta_Yi);

    /* [ p_n ] + [ \Delta P_i ]
       [     ] + [            ] */
    N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, yn_plus_delta_Yi);

    /* set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + chati * ark_mem->h;

    /* Evaluate q' with the current positions */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f2(step_mem, ark_mem->tn + ci * ark_mem->h,
                         yn_plus_delta_Yi, step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* Incremental velocity update:
       [            ] = [                ] + [       ]
       [ \Delta Q_i ] = [ \Delta Q_{i-1} ] + [ sdata ] */
    N_VLinearSum(ONE, delta_Yi, ark_mem->h * ai, step_mem->sdata, delta_Yi);

    /* if user-supplied stage postprocessing function, we error out since it
     * wont work with the increment form */
    if (ark_mem->ProcessStage != NULL)
    {
      arkProcessError(ark_mem, ARK_POSTPROCESS_STAGE_FAIL, __LINE__, __func__,
                      __FILE__,
                      "Compensated summation is not compatible with stage "
                      "PostProcessing!\n");
      return (ARK_POSTPROCESS_STAGE_FAIL);
    }
  }

  /*
    Now we compute the step solution via compensated summation.
     [ p_{n+1} ] = [ p_n ] + [ \Delta P_i ]
     [ q_{n+1} ] = [ q_n ] + [ \Delta Q_i ] */
  N_VLinearSum(ONE, delta_Yi, -ONE, step_mem->yerr, delta_Yi);
  N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, ark_mem->ycur);
  N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->yn, diff);
  N_VLinearSum(ONE, diff, -ONE, delta_Yi, step_mem->yerr);

  *nflagPtr = 0;
  *dsmPtr   = SUN_RCONST(0.0);

  return 0;
}